

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall bandit::detail::bandit_context::~bandit_context(bandit_context *this)

{
  bandit_context *this_local;
  
  ~bandit_context(this);
  operator_delete(this);
  return;
}

Assistant:

bandit_context(const char* desc, bool hard_skip_a)
          : desc_(desc), hard_skip_(hard_skip_a), is_executing_(false)
        {}